

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

string * __thiscall
libcellml::XmlNode::convertToString_abi_cxx11_(string *__return_storage_ptr__,XmlNode *this)

{
  xmlNodePtr pxVar1;
  undefined8 *puVar2;
  allocator<char> local_19;
  
  xmlKeepBlanksDefault(1);
  puVar2 = (undefined8 *)xmlBufferCreate();
  pxVar1 = this->mPimpl->mXmlNodePtr;
  xmlNodeDump(puVar2,pxVar1->doc,pxVar1,0,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)*puVar2,&local_19);
  xmlBufferFree(puVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::convertToString() const
{
    xmlKeepBlanksDefault(1);
    xmlBufferPtr buffer = xmlBufferCreate();
    xmlNodeDump(buffer, mPimpl->mXmlNodePtr->doc, mPimpl->mXmlNodePtr, 0, 0);
    std::string contentString = std::string(reinterpret_cast<const char *>(buffer->content));
    xmlBufferFree(buffer);
    return contentString;
}